

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

base_learner * setup_base(options_i *options,vw *all)

{
  _func_learner<char,_char>_ptr_options_i_ptr_vw_ptr *p_Var1;
  _Elt_pointer pp_Var2;
  learner<char,_char> *plVar3;
  
  do {
    pp_Var2 = (all->reduction_stack).c.
              super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pp_Var2 ==
        (all->reduction_stack).c.
        super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pp_Var2 = (all->reduction_stack).c.
                super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    p_Var1 = pp_Var2[-1];
    std::
    deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
    ::pop_back(&(all->reduction_stack).c);
    plVar3 = (*p_Var1)(options,all);
  } while (plVar3 == (learner<char,_char> *)0x0);
  return plVar3;
}

Assistant:

LEARNER::base_learner* setup_base(options_i& options, vw& all)
{
  auto setup_func = all.reduction_stack.top();
  all.reduction_stack.pop();
  auto base = setup_func(options, all);

  if (base == nullptr)
    return setup_base(options, all);
  else
    return base;
}